

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GMAA_MAA_ELSI.cpp
# Opt level: O0

void __thiscall
GMAA_MAA_ELSI::Fill_FirstOHtsI
          (GMAA_MAA_ELSI *this,Index ts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *firstOHtsI)

{
  Index IVar1;
  PlanningUnitMADPDiscrete *this_00;
  PlanningUnitMADPDiscrete *pPVar2;
  LIndex i;
  value_type_conflict1 *in_RDI;
  Index fI;
  Index agI;
  Index in_stack_ffffffffffffffc8;
  Index in_stack_ffffffffffffffcc;
  uint uVar3;
  
  uVar3 = 0;
  while( true ) {
    this_00 = (PlanningUnitMADPDiscrete *)(ulong)uVar3;
    pPVar2 = (PlanningUnitMADPDiscrete *)(**(code **)(*(long *)in_RDI + 0x30))();
    if (pPVar2 <= this_00) break;
    i = PlanningUnitMADPDiscrete::GetFirstObservationHistoryIndex
                  (this_00,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    IVar1 = Globals::CastLIndexToIndex(i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)CONCAT44(uVar3,IVar1),in_RDI);
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void  GMAA_MAA_ELSI::Fill_FirstOHtsI(Index ts, 
        vector<Index>& firstOHtsI)
{
    //because the OHs are constructed breath-first, we know the OHs for agent i
    //for this time step are numbered:
    //firstOHtsGI[i]...firstOHtsGI[i]+nrOH[i]-1
    //
    //(read first-OH-for-time-step-ts its Global Index)
    //
    //i.e. ohGI = ohI + firstOHtsGI 

    for(Index agI=0; agI < GetNrAgents(); agI++)
    {
        Index fI = CastLIndexToIndex(GetFirstObservationHistoryIndex(agI, ts));
        firstOHtsI.push_back(fI); 
    }
}